

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O2

void __thiscall
cnn::Model::load<boost::archive::text_iarchive>(Model *this,text_iarchive *ar,uint param_2)

{
  pointer ppPVar1;
  pointer ppLVar2;
  pointer ppPVar3;
  pointer ppPVar4;
  uint uVar5;
  pointer ppLVar6;
  int nlp;
  int np;
  Parameters *local_30;
  int local_28;
  int local_24;
  
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
            &ar->field_0x28,&local_24);
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
            &ar->field_0x28,&local_28);
  ppPVar4 = (this->params).super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppPVar3 = (this->params).super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_24 != (int)((ulong)((long)ppPVar4 - (long)ppPVar3) >> 3)) {
    __assert_fail("np == (int)params.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/model.h"
                  ,0x89,
                  "void cnn::Model::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
                 );
  }
  if (local_28 ==
      (int)((ulong)((long)(this->lookup_params).
                          super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->lookup_params).
                         super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    for (uVar5 = 0; (ulong)uVar5 < (ulong)((long)ppPVar4 - (long)ppPVar3 >> 3); uVar5 = uVar5 + 1) {
      boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
      invoke<cnn::Parameters>(ar,ppPVar3[uVar5]);
      ppPVar3 = (this->params).
                super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppPVar4 = (this->params).
                super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    uVar5 = 0;
    while( true ) {
      ppLVar6 = (this->lookup_params).
                super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->lookup_params).
                        super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar6 >> 3) <=
          (ulong)uVar5) break;
      boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
      invoke<cnn::LookupParameters>(ar,ppLVar6[uVar5]);
      uVar5 = uVar5 + 1;
    }
    ppPVar1 = (this->all_params).
              super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->all_params).
        super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppPVar1) {
      (this->all_params).
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppPVar1;
    }
    ppPVar3 = (this->params).
              super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppPVar4 = (this->params).
                   super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
                   .super__Vector_impl_data._M_start; ppPVar4 != ppPVar3; ppPVar4 = ppPVar4 + 1) {
      local_30 = *ppPVar4;
      std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
      emplace_back<cnn::ParametersBase*>
                ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,
                 (ParametersBase **)&local_30);
    }
    ppLVar2 = (this->lookup_params).
              super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppLVar6 = (this->lookup_params).
                   super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppLVar6 != ppLVar2;
        ppLVar6 = ppLVar6 + 1) {
      local_30 = (Parameters *)*ppLVar6;
      std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
      emplace_back<cnn::ParametersBase*>
                ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,
                 (ParametersBase **)&local_30);
    }
    return;
  }
  __assert_fail("nlp == (int)lookup_params.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/model.h"
                ,0x8a,
                "void cnn::Model::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
               );
}

Assistant:

void load(Archive& ar, const unsigned int) {
    int np, nlp;
    ar & np;
    ar & nlp;
    assert(np == (int)params.size());
    assert(nlp == (int)lookup_params.size());
    for (unsigned i = 0; i < params.size(); ++i)
      ar & *params[i];
    for (unsigned i = 0; i < lookup_params.size(); ++i)
      ar & *lookup_params[i];
    all_params.clear();
    for (auto p : params) all_params.push_back(p);
    for (auto p : lookup_params) all_params.push_back(p);
  }